

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.cpp
# Opt level: O1

void luaV_execute(lua_State *L,int nexeccalls)

{
  undefined8 uVar1;
  byte bVar2;
  global_State *pgVar3;
  void *pvVar4;
  CallInfo *pCVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  GCObject *pGVar9;
  UpVal *pUVar10;
  GCObject *pGVar11;
  Value *pVVar12;
  TValue *pTVar13;
  StkId pTVar14;
  TValue *pTVar15;
  uint *obj;
  uint *puVar16;
  Value *val;
  StkId pTVar17;
  long lVar18;
  int *piVar19;
  uint uVar20;
  StkId pTVar21;
  ulong uVar22;
  TValue *obj_00;
  uint uVar23;
  uint uVar24;
  char *pcVar25;
  lua_State *L_00;
  TMS op;
  uint *puVar26;
  TValue *o1;
  Value *pVVar27;
  StkId pTVar28;
  long lVar29;
  uint *puVar30;
  double dVar31;
  lua_Number lVar32;
  TValue g;
  TValue TStack_c8;
  TValue TStack_b8;
  lua_State *plStack_a8;
  Value *pVStack_a0;
  Value *pVStack_98;
  uint *puStack_90;
  ulong uStack_88;
  StkId pTStack_80;
  StkId local_70;
  GCObject *local_68;
  StkId local_60;
  int local_54;
  lua_State *local_50;
  uint *local_48;
  Value local_40;
  undefined4 local_38;
  
  local_54 = nexeccalls;
  local_50 = L;
  do {
    pTVar21 = L->base;
    local_68 = (L->ci->func->value).gc;
    local_70 = (StkId)((local_68->th).l_G)->frealloc;
    puVar26 = L->savedpc;
    do {
      puVar16 = puVar26 + 1;
      uVar24 = *puVar26;
      bVar2 = L->hookmask;
      if ((bVar2 & 0xc) != 0) {
        iVar7 = L->hookcount + -1;
        L->hookcount = iVar7;
        if ((bVar2 & 4) == 0 && iVar7 != 0) goto LAB_001169ff;
        puVar30 = L->savedpc;
        L->savedpc = puVar16;
        if ((bVar2 & 8) != 0 && iVar7 == 0) {
          L->hookcount = L->basehookcount;
          pTStack_80 = (StkId)0x11694f;
          luaD_callhook(L,3,-1);
          L = local_50;
        }
        if ((bVar2 & 4) != 0) {
          pgVar3 = (((L->ci->func->value).gc)->th).l_G;
          pvVar4 = pgVar3->ud;
          pGVar11 = pgVar3->rootgc;
          iVar7 = (int)((ulong)((long)puVar16 - (long)pvVar4) >> 2) + -1;
          if (pGVar11 == (GCObject *)0x0) {
            iVar8 = 0;
          }
          else {
            iVar8 = *(int *)((long)pGVar11 + (long)iVar7 * 4);
          }
          if ((iVar7 != 0) && (puVar30 < puVar16)) {
            if (pGVar11 == (GCObject *)0x0) {
              iVar7 = 0;
            }
            else {
              iVar7 = *(int *)((long)pGVar11 +
                              (((long)puVar30 - (long)pvVar4) * 0x40000000 + -0x100000000 >> 0x20) *
                              4);
            }
            if (iVar8 == iVar7) goto LAB_001169e6;
          }
          pTStack_80 = (StkId)0x1169db;
          luaD_callhook(L,2,iVar8);
          L = local_50;
        }
LAB_001169e6:
        if (L->status != '\x01') {
          pTVar21 = L->base;
          goto LAB_001169ff;
        }
        L->savedpc = puVar26;
        iVar7 = 1;
        goto LAB_00117a36;
      }
LAB_001169ff:
      if (0x25 < (uVar24 & 0x3f)) {
        iVar7 = 0;
        goto LAB_00117a36;
      }
      uVar23 = uVar24 >> 6 & 0xff;
      pVVar27 = (Value *)((long)&pTVar21->value + (ulong)(uVar23 << 4));
      obj = &switchD_00116a2f::switchdataD_0011f11c;
      puVar30 = puVar16;
      switch(uVar24 & 0x3f) {
      case 0:
        uVar22 = (ulong)(uVar24 >> 0x13 & 0xfffffff0);
        *pVVar27 = *(Value *)((long)&pTVar21->value + uVar22);
        iVar7 = *(int *)((long)&pTVar21->tt + uVar22);
        goto LAB_00117045;
      case 1:
        uVar22 = (ulong)(uVar24 >> 10 & 0xfffffff0);
        *pVVar27 = *(Value *)((long)&local_70->value + uVar22);
        iVar7 = *(int *)((long)&local_70->tt + uVar22);
        goto LAB_00117045;
      case 2:
        pVVar27->b = uVar24 >> 0x17;
        pVVar27[1].b = 1;
        puVar30 = puVar26 + 2;
        if ((uVar24 & 0x7fc000) == 0) {
          puVar30 = puVar16;
        }
        goto LAB_00117875;
      case 3:
        pVVar12 = (Value *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        do {
          pVVar12[1].b = 0;
          pVVar12 = pVVar12 + -2;
          iVar7 = 4;
        } while (pVVar27 <= pVVar12);
        break;
      case 4:
        pVVar12 = *(Value **)(*(long *)((long)local_68 + (ulong)(uVar24 >> 0x17) * 8 + 0x28) + 0x10)
        ;
        *pVVar27 = *pVVar12;
        iVar7 = pVVar12[1].b;
LAB_00117045:
        pVVar27[1].b = iVar7;
LAB_00117a2d:
        iVar7 = 4;
        break;
      case 5:
        pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 10 & 0xfffffff0));
        local_40 = (Value)(local_68->h).array;
        pVVar12 = &local_40;
        local_38 = 5;
        L->savedpc = puVar16;
        goto LAB_00117260;
      case 6:
        uVar22 = (ulong)(uVar24 >> 0x13 & 0xfffffff0);
        goto LAB_00117243;
      case 7:
        local_40 = (Value)(local_68->h).array;
        pVVar12 = &local_40;
        local_38 = 5;
        L->savedpc = puVar16;
        pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 10 & 0xfffffff0));
        val = pVVar27;
        goto LAB_0011701e;
      case 8:
        pGVar11 = *(GCObject **)((long)local_68 + (ulong)(uVar24 >> 0x17) * 8 + 0x28);
        pTVar13 = (pGVar11->p).k;
        pTVar13->value = *pVVar27;
        pTVar13->tt = pVVar27[1].b;
        iVar7 = 4;
        if (((3 < pVVar27[1].b) && (((pVVar27->gc->gch).marked & 3) != 0)) &&
           (((pGVar11->gch).marked & 4) != 0)) {
          pTStack_80 = (StkId)0x11736e;
          luaC_barrierf(L,pGVar11,pVVar27->gc);
        }
        break;
      case 9:
        pTVar13 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        if ((uVar24 >> 0x16 & 1) != 0) {
          pTVar21 = local_70;
        }
        L->savedpc = puVar16;
        val = (Value *)((long)&pTVar21->value + (ulong)(uVar24 >> 10 & 0xff0));
        pVVar12 = pVVar27;
LAB_0011701e:
        pTStack_80 = (StkId)0x117026;
        luaV_settable(L,(TValue *)pVVar12,pTVar13,(StkId)val);
        goto LAB_00117871;
      case 10:
        pTStack_80 = (StkId)0x1172be;
        iVar7 = luaO_fb2int(uVar24 >> 0x17);
        pTStack_80 = (StkId)0x1172c9;
        iVar8 = luaO_fb2int(uVar24 >> 0xe & 0x1ff);
        pTStack_80 = (StkId)0x1172d6;
        pGVar11 = (GCObject *)luaH_new(L,iVar7,iVar8);
        pVVar27->gc = pGVar11;
        pVVar27[1].b = 5;
        L->savedpc = puVar16;
        if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
          pTStack_80 = (StkId)0x117300;
          luaC_step(L);
        }
        pTVar21 = L->base;
        iVar7 = 4;
        break;
      case 0xb:
        uVar22 = (ulong)(uVar24 >> 0x13 & 0xfffffff0);
        pVVar27[2] = *(Value *)((long)&pTVar21->value + uVar22);
        pVVar27[3].b = *(int *)((long)&pTVar21->tt + uVar22);
LAB_00117243:
        pVVar12 = (Value *)((long)&pTVar21->value + uVar22);
        if ((uVar24 >> 0x16 & 1) != 0) {
          pTVar21 = local_70;
        }
        L->savedpc = puVar16;
        pTVar13 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 10 & 0xff0));
LAB_00117260:
        pTStack_80 = (StkId)0x117271;
        luaV_gettable(L,(TValue *)pVVar12,pTVar13,(StkId)pVVar27);
        goto LAB_00117871;
      case 0xc:
        pTVar15 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        pTVar17 = local_70;
        if ((uVar24 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar21;
        }
        pTVar13 = (TValue *)((long)&pTVar17->value + (ulong)(uVar24 >> 10 & 0xff0));
        if ((pTVar15->tt != 3) || (pTVar13->tt != 3)) {
          L->savedpc = puVar16;
          op = TM_ADD;
          goto LAB_0011786c;
        }
        lVar32 = (pTVar15->value).n + (pTVar13->value).n;
LAB_0011722c:
        pVVar27->n = lVar32;
LAB_0011790e:
        pVVar27[1].b = 3;
        goto LAB_00117a2d;
      case 0xd:
        pTVar15 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        pTVar17 = local_70;
        if ((uVar24 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar21;
        }
        pTVar13 = (TValue *)((long)&pTVar17->value + (ulong)(uVar24 >> 10 & 0xff0));
        if ((pTVar15->tt == 3) && (pTVar13->tt == 3)) {
          lVar32 = (pTVar15->value).n - (pTVar13->value).n;
          goto LAB_0011722c;
        }
        L->savedpc = puVar16;
        op = TM_SUB;
        goto LAB_0011786c;
      case 0xe:
        pTVar15 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        pTVar17 = local_70;
        if ((uVar24 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar21;
        }
        pTVar13 = (TValue *)((long)&pTVar17->value + (ulong)(uVar24 >> 10 & 0xff0));
        if ((pTVar15->tt == 3) && (pTVar13->tt == 3)) {
          lVar32 = (pTVar15->value).n * (pTVar13->value).n;
          goto LAB_0011722c;
        }
        L->savedpc = puVar16;
        op = TM_MUL;
        goto LAB_0011786c;
      case 0xf:
        pTVar15 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        pTVar17 = local_70;
        if ((uVar24 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar21;
        }
        pTVar13 = (TValue *)((long)&pTVar17->value + (ulong)(uVar24 >> 10 & 0xff0));
        if ((pTVar15->tt == 3) && (pTVar13->tt == 3)) {
          lVar32 = (pTVar15->value).n / (pTVar13->value).n;
          goto LAB_0011722c;
        }
        L->savedpc = puVar16;
        op = TM_DIV;
        goto LAB_0011786c;
      case 0x10:
        pTVar15 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        pTVar17 = local_70;
        if ((uVar24 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar21;
        }
        pTVar13 = (TValue *)((long)&pTVar17->value + (ulong)(uVar24 >> 10 & 0xff0));
        if ((pTVar15->tt != 3) || (pTVar13->tt != 3)) {
          L->savedpc = puVar16;
          op = TM_MOD;
          goto LAB_0011786c;
        }
        local_60 = (StkId)(pTVar15->value).n;
        local_48 = (uint *)(pTVar13->value).n;
        pTStack_80 = (StkId)0x116c53;
        dVar31 = floor((double)local_60 / (double)local_48);
        pVVar27->n = (double)local_60 - dVar31 * (double)local_48;
LAB_00117134:
        pVVar27[1].b = 3;
        goto LAB_00117875;
      case 0x11:
        pTVar15 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar15 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        pTVar17 = local_70;
        if ((uVar24 >> 0x16 & 1) == 0) {
          pTVar17 = pTVar21;
        }
        pTVar13 = (TValue *)((long)&pTVar17->value + (ulong)(uVar24 >> 10 & 0xff0));
        if ((pTVar15->tt == 3) && (pTVar13->tt == 3)) {
          pTStack_80 = (StkId)0x1170ed;
          lVar32 = pow((pTVar15->value).n,(pTVar13->value).n);
LAB_0011712e:
          pVVar27->n = lVar32;
          goto LAB_00117134;
        }
        L->savedpc = puVar16;
        op = TM_POW;
        goto LAB_0011786c;
      case 0x12:
        uVar22 = (ulong)(uVar24 >> 0x13 & 0xfffffff0);
        pTVar13 = (TValue *)((long)&pTVar21->value + uVar22);
        if (*(int *)((long)&pTVar21->tt + uVar22) == 3) {
          pVVar27->gc = (GCObject *)((ulong)(pTVar13->value).gc ^ 0x8000000000000000);
          goto LAB_0011790e;
        }
        L->savedpc = puVar16;
        op = TM_UNM;
        pTVar15 = pTVar13;
LAB_0011786c:
        pTStack_80 = (StkId)0x117871;
        Arith(L,(StkId)pVVar27,pTVar15,pTVar13,op);
LAB_00117871:
        pTVar21 = L->base;
        puVar30 = puVar16;
        goto LAB_00117875;
      case 0x13:
        uVar22 = (ulong)(uVar24 >> 0x13 & 0xfffffff0);
        iVar7 = *(int *)((long)&pTVar21->tt + uVar22);
        if (iVar7 == 0) {
          uVar24 = 1;
        }
        else if (iVar7 == 1) {
          uVar24 = (uint)(*(int *)((long)&pTVar21->value + uVar22) == 0);
        }
        else {
          uVar24 = 0;
        }
        *(uint *)pVVar27 = uVar24;
        pVVar27[1].b = 1;
        goto LAB_00117a2d;
      case 0x14:
        uVar22 = (ulong)(uVar24 >> 0x13 & 0xfffffff0);
        pTVar13 = (TValue *)((long)&pTVar21->value + uVar22);
        iVar7 = *(int *)((long)&pTVar21->tt + uVar22);
        if (iVar7 == 4) {
          uVar1 = *(undefined8 *)((long)(pTVar13->value).gc + 0x10);
          pVVar27->n = ((double)CONCAT44(0x45300000,(int)((ulong)uVar1 >> 0x20)) -
                       1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0);
          goto LAB_0011790e;
        }
        if (iVar7 == 5) {
          pTStack_80 = (StkId)0x117124;
          iVar7 = luaH_getn(&((pTVar13->value).gc)->h);
          lVar32 = (lua_Number)iVar7;
          goto LAB_0011712e;
        }
        L->savedpc = puVar16;
        pTStack_80 = (StkId)0x11793e;
        iVar7 = call_binTM(L,pTVar13,&luaO_nilobject_,(StkId)pVVar27,TM_LEN);
        if (iVar7 == 0) {
          pTStack_80 = (StkId)0x117954;
          luaG_typeerror(L,pTVar13,"get length of");
        }
        pTVar21 = L->base;
        iVar7 = 4;
        break;
      case 0x15:
        uVar20 = uVar24 >> 0xe & 0x1ff;
        L->savedpc = puVar16;
        pTStack_80 = (StkId)0x11719c;
        luaV_concat(L,(uVar20 - (uVar24 >> 0x17)) + 1,uVar20);
        if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
          pTStack_80 = (StkId)0x1171b2;
          luaC_step(L);
        }
        pTVar21 = L->base;
        uVar22 = (ulong)((uVar24 >> 0x17) << 4);
        *(undefined8 *)((long)&pTVar21->value + (ulong)(uVar23 << 4)) =
             *(undefined8 *)((long)&pTVar21->value + uVar22);
        *(undefined4 *)((long)&pTVar21->tt + (ulong)(uVar23 << 4)) =
             *(undefined4 *)((long)&pTVar21->tt + uVar22);
        goto LAB_00117875;
      case 0x16:
        goto switchD_00116a2f_caseD_16;
      case 0x17:
        pTVar13 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        if ((uVar24 >> 0x16 & 1) != 0) {
          pTVar21 = local_70;
        }
        uVar22 = (ulong)(uVar24 >> 10 & 0xff0);
        L->savedpc = puVar16;
        uVar24 = 0;
        if (pTVar13->tt == *(int *)((long)&pTVar21->tt + uVar22)) {
          pTStack_80 = (StkId)0x117508;
          uVar24 = luaV_equalval(L,pTVar13,(TValue *)((long)&pTVar21->value + uVar22));
        }
        goto LAB_001177fe;
      case 0x18:
        pTVar13 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        if ((uVar24 >> 0x16 & 1) != 0) {
          pTVar21 = local_70;
        }
        L->savedpc = puVar16;
        pTStack_80 = (StkId)0x116f21;
        uVar24 = luaV_lessthan(L,pTVar13,
                               (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 10 & 0xff0)));
        if (uVar24 == uVar23) {
          puVar16 = puVar26 + ((ulong)(*puVar16 >> 0xe) - 0x1fffe);
        }
        pTVar21 = L->base;
        goto LAB_00116f38;
      case 0x19:
        L->savedpc = puVar16;
        pTVar13 = (TValue *)((long)&pTVar21->value + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        if ((int)uVar24 < 0) {
          pTVar13 = (TValue *)((long)&local_70->value + (ulong)(uVar24 >> 0x13 & 0xff0));
        }
        if ((uVar24 >> 0x16 & 1) != 0) {
          pTVar21 = local_70;
        }
        uVar22 = (ulong)(uVar24 >> 10 & 0xff0);
        pTVar15 = (TValue *)((long)&pTVar21->value + uVar22);
        iVar7 = pTVar13->tt;
        if (iVar7 == *(int *)((long)&pTVar21->tt + uVar22)) {
          if (iVar7 == 4) {
            pTStack_80 = (StkId)0x117a6a;
            iVar7 = l_strcmp(&((pTVar13->value).gc)->ts,&((pTVar15->value).gc)->ts);
            uVar24 = (uint)(iVar7 < 1);
          }
          else if (iVar7 == 3) {
            uVar24 = (uint)((pTVar13->value).n <= (pTVar15->value).n);
          }
          else {
            pTStack_80 = (StkId)0x117a91;
            uVar24 = call_orderTM(L,pTVar13,pTVar15,TM_LE);
            if (uVar24 == 0xffffffff) {
              pTStack_80 = (StkId)0x117ab0;
              iVar7 = call_orderTM(L,pTVar15,pTVar13,TM_LT);
              if (iVar7 == -1) goto LAB_001177f6;
              uVar24 = (uint)(iVar7 == 0);
            }
          }
        }
        else {
LAB_001177f6:
          pTStack_80 = (StkId)0x1177fb;
          uVar24 = luaG_ordererror(L,pTVar13,pTVar15);
        }
LAB_001177fe:
        if (uVar24 == uVar23) {
          puVar16 = puVar16 + ((ulong)(*puVar16 >> 0xe) - 0x1ffff);
        }
        pTVar21 = L->base;
        goto LAB_00117a29;
      case 0x1a:
        if (pVVar27[1].b == 0) {
          uVar23 = 1;
        }
        else if (pVVar27[1].b == 1) {
          uVar23 = (uint)(pVVar27->b == 0);
        }
        else {
          uVar23 = 0;
        }
        if (uVar23 != (uVar24 >> 0xe & 0x1ff)) {
LAB_00117a18:
          puVar16 = puVar16 + ((ulong)(*puVar16 >> 0xe) - 0x1ffff);
        }
        goto LAB_00117a29;
      case 0x1b:
        uVar22 = (ulong)(uVar24 >> 0x13 & 0xfffffff0);
        pVVar12 = (Value *)((long)&pTVar21->value + uVar22);
        iVar7 = *(int *)((long)&pTVar21->tt + uVar22);
        if (iVar7 == 0) {
          uVar23 = 1;
        }
        else {
          uVar23 = 0;
          if (iVar7 == 1) {
            uVar23 = (uint)(pVVar12->b == 0);
          }
        }
        if (uVar23 != (uVar24 >> 0xe & 0x1ff)) {
          *pVVar27 = *pVVar12;
          pVVar27[1].b = iVar7;
          goto LAB_00117a18;
        }
LAB_00117a29:
        puVar16 = puVar16 + 1;
        goto LAB_00117a2d;
      case 0x1c:
        if (0x7fffff < uVar24) {
          L->top = (StkId)((long)pVVar27 + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        }
        uVar24 = uVar24 >> 0xe & 0x1ff;
        L->savedpc = puVar16;
        pTStack_80 = (StkId)0x11754a;
        iVar7 = luaD_precall(L,(StkId)pVVar27,uVar24 - 1);
        if (iVar7 == 0) {
          local_54 = local_54 + 1;
          iVar7 = 2;
        }
        else {
          if (iVar7 == 1) {
            if (uVar24 != 0) {
              L->top = L->ci->top;
            }
            goto LAB_00117871;
          }
LAB_001175b4:
          iVar7 = 1;
        }
        break;
      case 0x1d:
        if (0x7fffff < uVar24) {
          L->top = (StkId)((long)pVVar27 + (ulong)(uVar24 >> 0x13 & 0xfffffff0));
        }
        L->savedpc = puVar16;
        pTStack_80 = (StkId)0x1175a3;
        iVar7 = luaD_precall(L,(StkId)pVVar27,-1);
        if (iVar7 != 0) {
          if (iVar7 != 1) goto LAB_001175b4;
          goto LAB_00117871;
        }
        pCVar5 = L->ci;
        pTVar17 = pCVar5[-1].func;
        pTVar28 = pCVar5->func;
        if (L->openupval != (GCObject *)0x0) {
          pTStack_80 = (StkId)0x1179a4;
          luaF_close(L,pCVar5[-1].base);
        }
        pTVar14 = (StkId)(((long)pCVar5->base - (long)pTVar28) + (long)pCVar5[-1].func);
        pCVar5[-1].base = pTVar14;
        L->base = pTVar14;
        if (pTVar28 < L->top) {
          piVar19 = &pTVar17->tt;
          lVar29 = 0;
          do {
            ((TValue *)(piVar19 + -2))->value = pTVar28->value;
            *piVar19 = pTVar28->tt;
            lVar29 = lVar29 + 1;
            pTVar28 = pTVar28 + 1;
            piVar19 = piVar19 + 4;
          } while (pTVar28 < L->top);
        }
        else {
          lVar29 = 0;
        }
        pTVar17 = pTVar17 + lVar29;
        L->top = pTVar17;
        pCVar5[-1].top = pTVar17;
        pCVar5[-1].savedpc = L->savedpc;
        pCVar5[-1].tailcalls = pCVar5[-1].tailcalls + 1;
        L->ci = L->ci + -1;
        iVar7 = 2;
        break;
      case 0x1e:
        if (0x7fffff < uVar24) {
          L->top = (StkId)((long)pVVar27 + ((ulong)(uVar24 >> 0x13 & 0xfffffff0) - 0x10));
        }
        if (L->openupval != (GCObject *)0x0) {
          pTStack_80 = (StkId)0x1173ab;
          luaF_close(L,pTVar21);
        }
        L->savedpc = puVar16;
        pTStack_80 = (StkId)0x1173c0;
        iVar8 = luaD_poscall(L,(StkId)pVVar27);
        local_54 = local_54 + -1;
        if (local_54 == 0) {
          iVar7 = 1;
        }
        else {
          iVar7 = 2;
          if (iVar8 != 0) {
            L->top = L->ci->top;
          }
        }
        break;
      case 0x1f:
        dVar31 = pVVar27->n + pVVar27[4].n;
        iVar7 = 4;
        if (pVVar27[4].n <= 0.0) {
          if (pVVar27[2].n <= dVar31) goto LAB_00117826;
        }
        else if (dVar31 <= pVVar27[2].n) {
LAB_00117826:
          pVVar27->n = dVar31;
          pVVar27[1].b = 3;
          pVVar27[6].n = dVar31;
          pVVar27[7].b = 3;
          puVar16 = puVar16 + ((ulong)(uVar24 >> 0xe) - 0x1ffff);
          iVar7 = 4;
        }
        break;
      case 0x20:
        pVVar12 = pVVar27 + 4;
        L->savedpc = puVar16;
        pTVar17 = (StkId)(ulong)uVar23;
        if (pVVar27[1].b == 3) {
LAB_0011741d:
          if (pVVar27[3].b != 3) {
            pTStack_80 = (StkId)0x117438;
            pTVar13 = luaV_tonumber((TValue *)(pVVar27 + 2),(TValue *)(pVVar27 + 2));
            pTVar17 = pTVar21;
            if (pTVar13 == (TValue *)0x0) {
              pcVar25 = "\'for\' limit must be a number";
              goto LAB_00117afe;
            }
          }
          if (pVVar27[5].b != 3) {
            pTStack_80 = (StkId)0x117464;
            pVVar12 = &luaV_tonumber((TValue *)pVVar12,(TValue *)pVVar12)->value;
            plStack_a8 = local_50;
            L = local_50;
            if (pVVar12 == (Value *)0x0) {
              pcVar25 = "\'for\' step must be a number";
              pTStack_80 = (StkId)Arith;
              L_00 = local_50;
              puVar26 = puVar16;
              luaG_runerror(local_50,"\'for\' step must be a number");
              pVStack_a0 = pVVar27;
              pVStack_98 = pVVar12;
              puStack_90 = puVar16;
              uStack_88 = (ulong)uVar24;
              pTStack_80 = pTVar17;
              pTVar13 = luaV_tonumber(obj_00,&TStack_b8);
              if ((pTVar13 != (TValue *)0x0) &&
                 (pTVar15 = luaV_tonumber((TValue *)obj,&TStack_c8), pTVar15 != (TValue *)0x0)) {
                (*(code *)(&DAT_0011f1b4 +
                          *(int *)(&DAT_0011f1b4 + (ulong)((TMS)puVar26 - TM_ADD) * 4)))
                          ((pTVar13->value).gc,(pTVar15->value).gc);
                return;
              }
              iVar7 = call_binTM(L_00,obj_00,(TValue *)obj,(StkId)pcVar25,(TMS)puVar26);
              if (iVar7 == 0) {
                luaG_aritherror(L_00,obj_00,(TValue *)obj);
              }
              return;
            }
          }
        }
        else {
          pTStack_80 = (StkId)0x11740e;
          pTVar13 = luaV_tonumber((TValue *)pVVar27,(TValue *)pVVar27);
          pTVar17 = pTVar21;
          if (pTVar13 != (TValue *)0x0) goto LAB_0011741d;
          pcVar25 = "\'for\' initial value must be a number";
LAB_00117afe:
          pTStack_80 = (StkId)0x117b08;
          luaG_runerror(L,pcVar25);
        }
        pVVar27->n = pVVar27->n - pVVar12->n;
        pVVar27[1].b = 3;
        goto switchD_00116a2f_caseD_16;
      case 0x21:
        pVVar27[10] = pVVar27[4];
        pVVar27[0xb].b = pVVar27[5].b;
        pVVar27[8] = pVVar27[2];
        pVVar27[9].b = pVVar27[3].b;
        pVVar27[6] = *pVVar27;
        pVVar27[7].b = pVVar27[1].b;
        L->top = (StkId)(pVVar27 + 0xc);
        L->savedpc = puVar16;
        pTStack_80 = (StkId)0x116d33;
        luaD_call(L,(StkId)(pVVar27 + 6),uVar24 >> 0xe & 0x1ff);
        pTVar21 = L->base;
        L->top = L->ci->top;
        uVar22 = (ulong)(uVar23 << 4);
        iVar7 = *(int *)((long)&pTVar21[3].tt + uVar22);
        if (iVar7 != 0) {
          *(undefined8 *)((long)&pTVar21[2].value + uVar22) =
               *(undefined8 *)((long)&pTVar21[3].value + uVar22);
          *(int *)((long)&pTVar21[2].tt + uVar22) = iVar7;
          puVar16 = puVar26 + ((ulong)(*puVar16 >> 0xe) - 0x1fffe);
        }
LAB_00116f38:
        puVar30 = puVar16 + 1;
        goto LAB_00117875;
      case 0x22:
        if (uVar24 < 0x800000) {
          uVar20 = (int)((ulong)((long)L->top - (long)pVVar27) >> 4) - 1;
          L->top = L->ci->top;
        }
        else {
          uVar20 = uVar24 >> 0x17;
        }
        uVar24 = uVar24 >> 0xe & 0x1ff;
        if (uVar24 == 0) {
          uVar24 = puVar26[1];
          puVar16 = puVar26 + 2;
        }
        iVar7 = 0;
        if (pVVar27[1].b == 5) {
          pGVar11 = pVVar27->gc;
          iVar7 = uVar20 + uVar24 * 0x32 + -0x32;
          if ((pGVar11->h).sizearray < iVar7) {
            pTStack_80 = (StkId)0x11774a;
            luaH_resizearray(L,&pGVar11->h,iVar7);
            L = local_50;
          }
          iVar7 = 4;
          if (0 < (int)uVar20) {
            piVar19 = (int *)((long)&pTVar21[uVar20].tt + (ulong)(uVar23 << 4));
            uVar22 = (ulong)uVar20;
            local_60 = pTVar21;
            local_48 = puVar16;
            do {
              pTStack_80 = (StkId)0x11779a;
              pTVar13 = luaH_setnum(L,&pGVar11->h,uVar24 * 0x32 + -0x32 + (int)uVar22);
              pTVar13->value = *(Value *)(piVar19 + -2);
              pTVar13->tt = *piVar19;
              if (((3 < *piVar19) && ((*(byte *)(*(long *)(piVar19 + -2) + 9) & 3) != 0)) &&
                 (((pGVar11->gch).marked & 4) != 0)) {
                pTStack_80 = (StkId)0x1177ca;
                luaC_barrierback(L,&pGVar11->h);
              }
              piVar19 = piVar19 + -4;
              bVar6 = 1 < (long)uVar22;
              pTVar21 = local_60;
              puVar16 = local_48;
              uVar22 = uVar22 - 1;
              iVar7 = 4;
            } while (bVar6);
          }
        }
        break;
      case 0x23:
        pTStack_80 = (StkId)0x116ae1;
        luaF_close(L,(StkId)pVVar27);
LAB_00117875:
        puVar16 = puVar30;
        iVar7 = 4;
        break;
      case 0x24:
        pGVar11 = (&(((((local_68->h).node)->i_key).nk.next)->i_val).value)[uVar24 >> 0xe].gc;
        bVar2 = (byte)*(lu_mem *)&(pGVar11->p).nups;
        pTStack_80 = (StkId)0x116b1a;
        local_60 = pTVar21;
        pGVar9 = (GCObject *)luaF_newLclosure(L,(uint)bVar2,(Table *)(local_68->h).array);
        (pGVar9->th).l_G = (global_State *)pGVar11;
        if (bVar2 != 0) {
          lVar29 = 0;
          pTVar21 = local_60;
          do {
            uVar24 = *(uint *)((long)puVar16 + lVar29) >> 0x17;
            if ((*(uint *)((long)puVar16 + lVar29) & 0x3f) == 4) {
              pUVar10 = *(UpVal **)((long)local_68 + (ulong)uVar24 * 8 + 0x28);
            }
            else {
              pTStack_80 = (StkId)0x116b64;
              pUVar10 = luaF_findupval(L,(StkId)((long)&pTVar21->value + (ulong)(uVar24 << 4)));
              pTVar21 = local_60;
            }
            *(UpVal **)((long)pGVar9 + lVar29 * 2 + 0x28) = pUVar10;
            lVar29 = lVar29 + 4;
          } while ((ulong)bVar2 * 4 != lVar29);
          puVar16 = (uint *)((long)puVar16 + lVar29);
        }
        pVVar27->gc = pGVar9;
        pVVar27[1].b = 6;
        L->savedpc = puVar16;
        if (L->l_G->GCthreshold <= L->l_G->totalbytes) {
          pTStack_80 = (StkId)0x1178aa;
          luaC_step(L);
        }
        goto LAB_00117871;
      case 0x25:
        pCVar5 = L->ci;
        uVar20 = ~(uint)*(byte *)((long)&((local_68->th).l_G)->GCthreshold + 1) +
                 (int)((ulong)((long)pCVar5->base - (long)pCVar5->func) >> 4);
        lVar29 = (long)(int)uVar20;
        if (uVar24 < 0x800000) {
          L->savedpc = puVar16;
          if ((long)L->stack_last - (long)L->top <= (long)(int)(uVar20 * 0x10)) {
            pTStack_80 = (StkId)0x116aa7;
            luaD_growstack(L,uVar20);
          }
          pTVar21 = L->base;
          pVVar27 = (Value *)((long)&pTVar21->value + (ulong)(uVar23 << 4));
          L->top = (StkId)(pVVar27 + lVar29 * 2);
        }
        else {
          uVar20 = (uVar24 >> 0x17) - 1;
        }
        iVar7 = 4;
        if (0 < (int)uVar20) {
          pVVar27 = pVVar27 + 1;
          lVar18 = lVar29 * -0x10;
          uVar22 = 0;
          do {
            if ((long)uVar22 < lVar29) {
              pTVar17 = pCVar5->base;
              *(undefined8 *)(&pVVar27->b + -2) = *(undefined8 *)((long)&pTVar17->value + lVar18);
              pVVar27->b = *(int *)((long)&pTVar17->tt + lVar18);
            }
            else {
              pVVar27->b = 0;
            }
            uVar22 = uVar22 + 1;
            pVVar27 = (Value *)(&pVVar27->b + 4);
            lVar18 = lVar18 + 0x10;
          } while (uVar20 != uVar22);
        }
      }
LAB_00117a36:
      puVar26 = puVar16;
    } while ((iVar7 == 0) || (iVar7 == 4));
    if (iVar7 != 2) {
      return;
    }
  } while( true );
switchD_00116a2f_caseD_16:
  puVar30 = puVar16 + ((ulong)(uVar24 >> 0xe) - 0x1ffff);
  goto LAB_00117875;
}

Assistant:

void luaV_execute (lua_State *L, int nexeccalls) {
  LClosure *cl;
  StkId base;
  TValue *k;
  const Instruction *pc;
 reentry:  /* entry point */
  lua_assert(isLua(L->ci));
  pc = L->savedpc;
  cl = &clvalue(L->ci->func)->l;
  base = L->base;
  k = cl->p->k;
  /* main loop of interpreter */
  for (;;) {
    const Instruction i = *pc++;
    StkId ra;
    if ((L->hookmask & (LUA_MASKLINE | LUA_MASKCOUNT)) &&
        (--L->hookcount == 0 || L->hookmask & LUA_MASKLINE)) {
      traceexec(L, pc);
      if (L->status == LUA_YIELD) {  /* did hook yield? */
        L->savedpc = pc - 1;
        return;
      }
      base = L->base;
    }
    /* warning!! several calls may realloc the stack and invalidate `ra' */
    ra = RA(i);
    lua_assert(base == L->base && L->base == L->ci->base);
    lua_assert(base <= L->top && L->top <= L->stack + L->stacksize);
    lua_assert(L->top == L->ci->top || luaG_checkopenop(i));
    switch (GET_OPCODE(i)) {
      case OP_MOVE: {
        setobjs2s(L, ra, RB(i));
        continue;
      }
      case OP_LOADK: {
        setobj2s(L, ra, KBx(i));
        continue;
      }
      case OP_LOADBOOL: {
        setbvalue(ra, GETARG_B(i));
        if (GETARG_C(i)) pc++;  /* skip next instruction (if C) */
        continue;
      }
      case OP_LOADNIL: {
        TValue *rb = RB(i);
        do {
          setnilvalue(rb--);
        } while (rb >= ra);
        continue;
      }
      case OP_GETUPVAL: {
        int b = GETARG_B(i);
        setobj2s(L, ra, cl->upvals[b]->v);
        continue;
      }
      case OP_GETGLOBAL: {
        TValue g;
        TValue *rb = KBx(i);
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(rb));
        Protect(luaV_gettable(L, &g, rb, ra));
        continue;
      }
      case OP_GETTABLE: {
        Protect(luaV_gettable(L, RB(i), RKC(i), ra));
        continue;
      }
      case OP_SETGLOBAL: {
        TValue g;
        sethvalue(L, &g, cl->env);
        lua_assert(ttisstring(KBx(i)));
        Protect(luaV_settable(L, &g, KBx(i), ra));
        continue;
      }
      case OP_SETUPVAL: {
        UpVal *uv = cl->upvals[GETARG_B(i)];
        setobj(L, uv->v, ra);
        luaC_barrier(L, uv, ra);
        continue;
      }
      case OP_SETTABLE: {
        Protect(luaV_settable(L, ra, RKB(i), RKC(i)));
        continue;
      }
      case OP_NEWTABLE: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        sethvalue(L, ra, luaH_new(L, luaO_fb2int(b), luaO_fb2int(c)));
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_SELF: {
        StkId rb = RB(i);
        setobjs2s(L, ra+1, rb);
        Protect(luaV_gettable(L, rb, RKC(i), ra));
        continue;
      }
      case OP_ADD: {
        arith_op(luai_numadd, TM_ADD);
        continue;
      }
      case OP_SUB: {
        arith_op(luai_numsub, TM_SUB);
        continue;
      }
      case OP_MUL: {
        arith_op(luai_nummul, TM_MUL);
        continue;
      }
      case OP_DIV: {
        arith_op(luai_numdiv, TM_DIV);
        continue;
      }
      case OP_MOD: {
        arith_op(luai_nummod, TM_MOD);
        continue;
      }
      case OP_POW: {
        arith_op(luai_numpow, TM_POW);
        continue;
      }
      case OP_UNM: {
        TValue *rb = RB(i);
        if (ttisnumber(rb)) {
          lua_Number nb = nvalue(rb);
          setnvalue(ra, luai_numunm(nb));
        }
        else {
          Protect(Arith(L, ra, rb, rb, TM_UNM));
        }
        continue;
      }
      case OP_NOT: {
        int res = l_isfalse(RB(i));  /* next assignment may change this value */
        setbvalue(ra, res);
        continue;
      }
      case OP_LEN: {
        const TValue *rb = RB(i);
        switch (ttype(rb)) {
          case LUA_TTABLE: {
            setnvalue(ra, cast_num(luaH_getn(hvalue(rb))));
            break;
          }
          case LUA_TSTRING: {
            setnvalue(ra, cast_num(tsvalue(rb)->len));
            break;
          }
          default: {  /* try metamethod */
            Protect(
              if (!call_binTM(L, rb, luaO_nilobject, ra, TM_LEN))
                luaG_typeerror(L, rb, "get length of");
            )
          }
        }
        continue;
      }
      case OP_CONCAT: {
        int b = GETARG_B(i);
        int c = GETARG_C(i);
        Protect(luaV_concat(L, c-b+1, c); luaC_checkGC(L));
        setobjs2s(L, RA(i), base+b);
        continue;
      }
      case OP_JMP: {
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_EQ: {
        TValue *rb = RKB(i);
        TValue *rc = RKC(i);
        Protect(
          if (equalobj(L, rb, rc) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LT: {
        Protect(
          if (luaV_lessthan(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_LE: {
        Protect(
          if (lessequal(L, RKB(i), RKC(i)) == GETARG_A(i))
            dojump(L, pc, GETARG_sBx(*pc));
        )
        pc++;
        continue;
      }
      case OP_TEST: {
        if (l_isfalse(ra) != GETARG_C(i))
          dojump(L, pc, GETARG_sBx(*pc));
        pc++;
        continue;
      }
      case OP_TESTSET: {
        TValue *rb = RB(i);
        if (l_isfalse(rb) != GETARG_C(i)) {
          setobjs2s(L, ra, rb);
          dojump(L, pc, GETARG_sBx(*pc));
        }
        pc++;
        continue;
      }
      case OP_CALL: {
        int b = GETARG_B(i);
        int nresults = GETARG_C(i) - 1;
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        switch (luaD_precall(L, ra, nresults)) {
          case PCRLUA: {
            nexeccalls++;
            goto reentry;  /* restart luaV_execute over new Lua function */
          }
          case PCRC: {
            /* it was a C function (`precall' called it); adjust results */
            if (nresults >= 0) L->top = L->ci->top;
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_TAILCALL: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b;  /* else previous instruction set top */
        L->savedpc = pc;
        lua_assert(GETARG_C(i) - 1 == LUA_MULTRET);
        switch (luaD_precall(L, ra, LUA_MULTRET)) {
          case PCRLUA: {
            /* tail call: put new frame in place of previous one */
            CallInfo *ci = L->ci - 1;  /* previous frame */
            int aux;
            StkId func = ci->func;
            StkId pfunc = (ci+1)->func;  /* previous function index */
            if (L->openupval) luaF_close(L, ci->base);
            L->base = ci->base = ci->func + ((ci+1)->base - pfunc);
            for (aux = 0; pfunc+aux < L->top; aux++)  /* move frame down */
              setobjs2s(L, func+aux, pfunc+aux);
            ci->top = L->top = func+aux;  /* correct top */
            lua_assert(L->top == L->base + clvalue(func)->l.p->maxstacksize);
            ci->savedpc = L->savedpc;
            ci->tailcalls++;  /* one more call lost */
            L->ci--;  /* remove new frame */
            goto reentry;
          }
          case PCRC: {  /* it was a C function (`precall' called it) */
            base = L->base;
            continue;
          }
          default: {
            return;  /* yield */
          }
        }
      }
      case OP_RETURN: {
        int b = GETARG_B(i);
        if (b != 0) L->top = ra+b-1;
        if (L->openupval) luaF_close(L, base);
        L->savedpc = pc;
        b = luaD_poscall(L, ra);
        if (--nexeccalls == 0)  /* was previous function running `here'? */
          return;  /* no: return */
        else {  /* yes: continue its execution */
          if (b) L->top = L->ci->top;
          lua_assert(isLua(L->ci));
          lua_assert(GET_OPCODE(*((L->ci)->savedpc - 1)) == OP_CALL);
          goto reentry;
        }
      }
      case OP_FORLOOP: {
        lua_Number step = nvalue(ra+2);
        lua_Number idx = luai_numadd(nvalue(ra), step); /* increment index */
        lua_Number limit = nvalue(ra+1);
        if (luai_numlt(0, step) ? luai_numle(idx, limit)
                                : luai_numle(limit, idx)) {
          dojump(L, pc, GETARG_sBx(i));  /* jump back */
          setnvalue(ra, idx);  /* update internal index... */
          setnvalue(ra+3, idx);  /* ...and external index */
        }
        continue;
      }
      case OP_FORPREP: {
        const TValue *init = ra;
        const TValue *plimit = ra+1;
        const TValue *pstep = ra+2;
        L->savedpc = pc;  /* next steps may throw errors */
        if (!tonumber(init, ra))
          luaG_runerror(L, LUA_QL("for") " initial value must be a number");
        else if (!tonumber(plimit, ra+1))
          luaG_runerror(L, LUA_QL("for") " limit must be a number");
        else if (!tonumber(pstep, ra+2))
          luaG_runerror(L, LUA_QL("for") " step must be a number");
        setnvalue(ra, luai_numsub(nvalue(ra), nvalue(pstep)));
        dojump(L, pc, GETARG_sBx(i));
        continue;
      }
      case OP_TFORLOOP: {
        StkId cb = ra + 3;  /* call base */
        setobjs2s(L, cb+2, ra+2);
        setobjs2s(L, cb+1, ra+1);
        setobjs2s(L, cb, ra);
        L->top = cb+3;  /* func. + 2 args (state and index) */
        Protect(luaD_call(L, cb, GETARG_C(i)));
        L->top = L->ci->top;
        cb = RA(i) + 3;  /* previous call may change the stack */
        if (!ttisnil(cb)) {  /* continue loop? */
          setobjs2s(L, cb-1, cb);  /* save control variable */
          dojump(L, pc, GETARG_sBx(*pc));  /* jump back */
        }
        pc++;
        continue;
      }
      case OP_SETLIST: {
        int n = GETARG_B(i);
        int c = GETARG_C(i);
        int last;
        Table *h;
        if (n == 0) {
          n = cast_int(L->top - ra) - 1;
          L->top = L->ci->top;
        }
        if (c == 0) c = cast_int(*pc++);
        runtime_check(L, ttistable(ra));
        h = hvalue(ra);
        last = ((c-1)*LFIELDS_PER_FLUSH) + n;
        if (last > h->sizearray)  /* needs more space? */
          luaH_resizearray(L, h, last);  /* pre-alloc it at once */
        for (; n > 0; n--) {
          TValue *val = ra+n;
          setobj2t(L, luaH_setnum(L, h, last--), val);
          luaC_barriert(L, h, val);
        }
        continue;
      }
      case OP_CLOSE: {
        luaF_close(L, ra);
        continue;
      }
      case OP_CLOSURE: {
        Proto *p;
        Closure *ncl;
        int nup, j;
        p = cl->p->p[GETARG_Bx(i)];
        nup = p->nups;
        ncl = luaF_newLclosure(L, nup, cl->env);
        ncl->l.p = p;
        for (j=0; j<nup; j++, pc++) {
          if (GET_OPCODE(*pc) == OP_GETUPVAL)
            ncl->l.upvals[j] = cl->upvals[GETARG_B(*pc)];
          else {
            lua_assert(GET_OPCODE(*pc) == OP_MOVE);
            ncl->l.upvals[j] = luaF_findupval(L, base + GETARG_B(*pc));
          }
        }
        setclvalue(L, ra, ncl);
        Protect(luaC_checkGC(L));
        continue;
      }
      case OP_VARARG: {
        int b = GETARG_B(i) - 1;
        int j;
        CallInfo *ci = L->ci;
        int n = cast_int(ci->base - ci->func) - cl->p->numparams - 1;
        if (b == LUA_MULTRET) {
          Protect(luaD_checkstack(L, n));
          ra = RA(i);  /* previous call may change the stack */
          b = n;
          L->top = ra + n;
        }
        for (j = 0; j < b; j++) {
          if (j < n) {
            setobjs2s(L, ra + j, ci->base - n + j);
          }
          else {
            setnilvalue(ra + j);
          }
        }
        continue;
      }
    }
  }
}